

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextFilter::ImGuiTextFilter(ImGuiTextFilter *this,char *default_filter)

{
  ImGuiTextFilter *in_RSI;
  char *in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  ImVector<ImGuiTextFilter::ImGuiTextRange>::ImVector
            ((ImVector<ImGuiTextFilter::ImGuiTextRange> *)(in_RDI + 0x100));
  if (in_RSI == (ImGuiTextFilter *)0x0) {
    *in_RDI = '\0';
    in_RDI[0x110] = '\0';
    in_RDI[0x111] = '\0';
    in_RDI[0x112] = '\0';
    in_RDI[0x113] = '\0';
  }
  else {
    ImStrncpy(in_RDI,in_stack_ffffffffffffffc8,0x172e65);
    Build(in_RSI);
  }
  return;
}

Assistant:

ImGuiTextFilter::ImGuiTextFilter(const char* default_filter)
{
    if (default_filter)
    {
        ImStrncpy(InputBuf, default_filter, IM_ARRAYSIZE(InputBuf));
        Build();
    }
    else
    {
        InputBuf[0] = 0;
        CountGrep = 0;
    }
}